

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdnewpfor.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>::decodeArray
          (SIMDNewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,size_t param_3,
          uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  ulong uVar5;
  uint32_t *out_00;
  reference pvVar6;
  long in_RCX;
  uint *in_RSI;
  uint32_t *in_RDI;
  ulong *in_R8;
  uint32_t lpos;
  uint32_t e;
  uint32_t *beginout;
  size_t twonexceptions;
  uint32_t encodedExceptionsSize;
  size_t nExceptions;
  uint32_t b;
  uint32_t i;
  uint32_t numBlocks;
  uint32_t *initout;
  size_t in_stack_ffffffffffffff68;
  NotEnoughStorage *in_stack_ffffffffffffff70;
  size_t *nvalue_00;
  size_t in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  uint local_44;
  long local_20;
  uint *local_10;
  
  if (*in_R8 < (ulong)(*in_RSI << 7)) {
    uVar4 = __cxa_allocate_exception(0x18);
    NotEnoughStorage::NotEnoughStorage(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    __cxa_throw(uVar4,&NotEnoughStorage::typeinfo,NotEnoughStorage::~NotEnoughStorage);
  }
  local_10 = in_RSI + 1;
  uVar1 = *in_RSI;
  local_20 = in_RCX;
  for (local_44 = 0; local_44 < uVar1; local_44 = local_44 + 1) {
    uVar2 = *local_10;
    uVar5 = (ulong)(*local_10 >> 0x10 & 0x3ff);
    uVar3 = *local_10 & 0xffff;
    if (uVar3 != 0) {
      out_00 = (uint32_t *)(ulong)uVar3;
      nvalue_00 = (size_t *)(local_10 + 1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),0);
      Simple16<false>::decodeArray
                ((Simple16<false> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_RDI,in_stack_ffffffffffffff80,out_00,nvalue_00);
    }
    usimdunpack((__m128i *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI,
                (uint32_t)(in_stack_ffffffffffffff80 >> 0x20));
    local_10 = (uint *)((long)(local_10 + 1) + (ulong)((uVar2 >> 0x1a) << 2) * 4 + (ulong)uVar3 * 4)
    ;
    in_stack_ffffffffffffff90 = 0xffffffff;
    for (in_stack_ffffffffffffff94 = 0; in_stack_ffffffffffffff94 < uVar5;
        in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),
                          (ulong)in_stack_ffffffffffffff94);
      in_stack_ffffffffffffff90 = *pvVar6 + 1 + in_stack_ffffffffffffff90;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),
                          in_stack_ffffffffffffff94 + uVar5);
      *(value_type *)(local_20 + (ulong)in_stack_ffffffffffffff90 * 4) =
           *pvVar6 + 1 << ((byte)(uVar2 >> 0x1a) & 0x1f) |
           *(uint *)(local_20 + (ulong)in_stack_ffffffffffffff90 * 4);
    }
    local_20 = local_20 + 0x200;
  }
  if (*in_R8 < (ulong)(local_20 - in_RCX >> 2)) {
    fprintf(_stderr,"possible buffer overrun\n");
  }
  *in_R8 = local_20 - in_RCX >> 2;
  return local_10;
}

Assistant:

const uint32_t *
SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::decodeArray(
#ifndef NDEBUG
    const uint32_t *in, const size_t len, uint32_t *out, size_t &nvalue) {
#else
    const uint32_t *in, const size_t, uint32_t *out, size_t &nvalue) {
#endif
#ifndef NDEBUG
  const uint32_t *const initin(in);
#endif
  const uint32_t *const initout(out);

  if (BlockSize * (*in) > nvalue)
    throw NotEnoughStorage(*in);
  const uint32_t numBlocks = *in++;

  for (uint32_t i = 0; i < numBlocks; i++) {

    const uint32_t b = *in >> (32 - PFORDELTA_B);

    const size_t nExceptions =
        (*in >> (32 - (PFORDELTA_B + PFORDELTA_NEXCEPT))) &
        ((1 << PFORDELTA_NEXCEPT) - 1);

    const uint32_t encodedExceptionsSize =
        *in & ((1 << PFORDELTA_EXCEPTSZ) - 1);

    size_t twonexceptions = 2 * nExceptions;
    ++in;
    if (encodedExceptionsSize > 0)
      ecoder.decodeArray(in, encodedExceptionsSize, &exceptions[0],
                         twonexceptions);
    assert(twonexceptions >= 2 * nExceptions);
    in += encodedExceptionsSize;

    uint32_t *beginout(out); // we use this later
    usimdunpack(reinterpret_cast<const __m128i *>(in), out, b);
    in += 4 * b;
    out += 128;

    for (uint32_t e = 0, lpos = 0u-1; e < nExceptions; e++) {
      lpos += exceptions[e] + 1;
      beginout[lpos] |= (exceptions[e + nExceptions] + 1) << b;
    }
  }
  if (static_cast<size_t>(out - initout) > nvalue) {
    fprintf(stderr, "possible buffer overrun\n");
  }
  ASSERT(in <= len + initin,
      std::to_string(in - initin) + " " + std::to_string(len));

  nvalue = out - initout;
  assert(nvalue == numBlocks * BlockSize);
  return in;
}